

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O0

int messagereceiver_get_link_name(MESSAGE_RECEIVER_HANDLE message_receiver,char **link_name)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  char **link_name_local;
  MESSAGE_RECEIVER_HANDLE message_receiver_local;
  
  if (message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_receiver.c"
                ,"messagereceiver_get_link_name",0x1ae,1,"NULL message_receiver");
    }
    l._4_4_ = 0x1af;
  }
  else {
    iVar1 = link_get_name(message_receiver->link,link_name);
    if (iVar1 == 0) {
      l._4_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_receiver.c"
                  ,"messagereceiver_get_link_name",0x1b5,1,"Getting link name failed");
      }
      l._4_4_ = 0x1b6;
    }
  }
  return l._4_4_;
}

Assistant:

int messagereceiver_get_link_name(MESSAGE_RECEIVER_HANDLE message_receiver, const char** link_name)
{
    int result;

    if (message_receiver == NULL)
    {
        LogError("NULL message_receiver");
        result = MU_FAILURE;
    }
    else
    {
        if (link_get_name(message_receiver->link, link_name) != 0)
        {
            LogError("Getting link name failed");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }

    return result;
}